

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_replace(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  lua_Unsigned m;
  int f;
  lua_Unsigned v;
  lua_Unsigned r;
  lua_State *plStack_10;
  int w;
  lua_State *L_local;
  
  plStack_10 = L;
  uVar2 = luaL_checkinteger(L,1);
  uVar3 = luaL_checkinteger(plStack_10,2);
  iVar1 = fieldargs(plStack_10,3,(int *)((long)&r + 4));
  uVar4 = 0x1fffffffe << (r._4_1_ - 1U & 0x3f) ^ 0xffffffffffffffff;
  lua_pushinteger(plStack_10,
                  uVar2 & 0xffffffff & (uVar4 << ((byte)iVar1 & 0x3f) ^ 0xffffffffffffffff) |
                  (uVar3 & 0xffffffff & uVar4) << ((byte)iVar1 & 0x3f));
  return 1;
}

Assistant:

static int b_replace (lua_State *L) {
  int w;
  lua_Unsigned r = trim(checkunsigned(L, 1));
  lua_Unsigned v = trim(checkunsigned(L, 2));
  int f = fieldargs(L, 3, &w);
  lua_Unsigned m = mask(w);
  r = (r & ~(m << f)) | ((v & m) << f);
  pushunsigned(L, r);
  return 1;
}